

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::cpp::CppGenerator::GenUnpackVal
          (string *__return_storage_ptr__,CppGenerator *this,Type *type,string *val,bool invector,
          FieldDef *afield)

{
  BaseType BVar1;
  Definition *def;
  bool bVar2;
  Value *pVVar3;
  char *pcVar4;
  char *local_400;
  bool local_362;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  string local_2e0;
  string local_2c0;
  allocator<char> local_299;
  undefined1 local_298 [8];
  string ptype_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 local_1f8 [8];
  string ptype;
  string local_1d0;
  undefined1 local_1b0 [8];
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  allocator<char> local_149;
  string local_148;
  Value *local_128;
  Value *pack_name;
  string local_118;
  Value *local_f8;
  Value *native_type;
  SymbolTable<flatbuffers::Value> *struct_attrs;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  FieldDef *local_38;
  FieldDef *afield_local;
  string *psStack_28;
  bool invector_local;
  string *val_local;
  Type *type_local;
  CppGenerator *this_local;
  string *unpack_call;
  
  BVar1 = type->base_type;
  local_38 = afield;
  afield_local._7_1_ = invector;
  psStack_28 = val;
  val_local = (string *)type;
  type_local = (Type *)this;
  this_local = (CppGenerator *)__return_storage_ptr__;
  if (BVar1 == BASE_TYPE_STRING) {
    bVar2 = FlexibleStringConstructor(this,afield);
    if (bVar2) {
      NativeString_abi_cxx11_(&local_d8,this,local_38);
      std::operator+(&local_b8,&local_d8,"(");
      std::operator+(&local_98,&local_b8,psStack_28);
      std::operator+(&local_78,&local_98,"->c_str(), ");
      std::operator+(&local_58,&local_78,psStack_28);
      std::operator+(__return_storage_ptr__,&local_58,"->size())");
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    else {
      std::operator+(__return_storage_ptr__,psStack_28,"->str()");
    }
  }
  else if (BVar1 == BASE_TYPE_STRUCT) {
    bVar2 = IsStruct(type);
    if (bVar2) {
      pVVar3 = (Value *)(val_local->_M_string_length + 0x58);
      native_type = pVVar3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"native_type",(allocator<char> *)((long)&pack_name + 7));
      pVVar3 = SymbolTable<flatbuffers::Value>::Lookup
                         ((SymbolTable<flatbuffers::Value> *)pVVar3,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator((allocator<char> *)((long)&pack_name + 7));
      local_f8 = pVVar3;
      if (pVVar3 == (Value *)0x0) {
        if (((afield_local._7_1_ & 1) == 0) && ((local_38->native_inline & 1U) == 0)) {
          def = (Definition *)val_local->_M_string_length;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1d0,"",(allocator<char> *)(ptype.field_2._M_local_buf + 0xf));
          BaseGenerator::WrapInNameSpace
                    ((string *)local_1b0,&this->super_BaseGenerator,def,&local_1d0);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::allocator<char>::~allocator((allocator<char> *)(ptype.field_2._M_local_buf + 0xf));
          GenTypeNativePtr((string *)local_1f8,this,(string *)local_1b0,local_38,true);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&ptype_1.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1f8,"(new ");
          std::operator+(&local_258,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&ptype_1.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1b0);
          std::operator+(&local_238,&local_258,"(*");
          std::operator+(&local_218,&local_238,psStack_28);
          std::operator+(__return_storage_ptr__,&local_218,"))");
          std::__cxx11::string::~string((string *)&local_218);
          std::__cxx11::string::~string((string *)&local_238);
          std::__cxx11::string::~string((string *)&local_258);
          std::__cxx11::string::~string((string *)(ptype_1.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_1f8);
          std::__cxx11::string::~string((string *)local_1b0);
        }
        else {
          std::operator+(__return_storage_ptr__,"*",psStack_28);
        }
      }
      else {
        pack_name._6_1_ = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"::flatbuffers::UnPack",
                   (allocator<char> *)((long)&pack_name + 5));
        std::allocator<char>::~allocator((allocator<char> *)((long)&pack_name + 5));
        pVVar3 = native_type;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_148,"native_type_pack_name",&local_149);
        pVVar3 = SymbolTable<flatbuffers::Value>::Lookup
                           ((SymbolTable<flatbuffers::Value> *)pVVar3,&local_148);
        std::__cxx11::string::~string((string *)&local_148);
        std::allocator<char>::~allocator(&local_149);
        local_128 = pVVar3;
        if (pVVar3 != (Value *)0x0) {
          std::__cxx11::string::operator+=
                    ((string *)__return_storage_ptr__,(string *)&pVVar3->constant);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&name.field_2 + 8),"(*",psStack_28);
        std::operator+(&local_170,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&name.field_2 + 8),")");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_170);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
      }
    }
    else {
      pcVar4 = "";
      if ((local_38->native_inline & 1U) != 0) {
        pcVar4 = "*";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_298,pcVar4,&local_299);
      std::allocator<char>::~allocator(&local_299);
      WrapNativeNameInNameSpace_abi_cxx11_
                (&local_2e0,this,(StructDef *)val_local->_M_string_length,
                 &(this->opts_).super_IDLOptions);
      GenTypeNativePtr(&local_2c0,this,&local_2e0,local_38,true);
      std::__cxx11::string::operator+=((string *)local_298,(string *)&local_2c0);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::operator+(&local_320,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298,
                     "(");
      std::operator+(&local_300,&local_320,psStack_28);
      std::operator+(__return_storage_ptr__,&local_300,"->UnPack(_resolver))");
      std::__cxx11::string::~string((string *)&local_300);
      std::__cxx11::string::~string((string *)&local_320);
      std::__cxx11::string::~string((string *)local_298);
    }
  }
  else if (BVar1 == BASE_TYPE_UNION) {
    pcVar4 = "";
    if (invector) {
      pcVar4 = "->Get(_i)";
    }
    if (!invector) {
      local_400 = "";
    }
    else {
      std::operator+(&local_360,"->GetEnum<",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     type->enum_def);
      std::operator+(&local_340,&local_360,">(_i)");
      local_400 = (char *)std::__cxx11::string::c_str();
    }
    local_362 = invector;
    GenUnionUnpackVal_abi_cxx11_(__return_storage_ptr__,this,afield,pcVar4,local_400);
    if (local_362) {
      std::__cxx11::string::~string((string *)&local_340);
      std::__cxx11::string::~string((string *)&local_360);
    }
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)val);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenUnpackVal(const Type &type, const std::string &val,
                           bool invector, const FieldDef &afield) {
    switch (type.base_type) {
      case BASE_TYPE_STRING: {
        if (FlexibleStringConstructor(&afield)) {
          return NativeString(&afield) + "(" + val + "->c_str(), " + val +
                 "->size())";
        } else {
          return val + "->str()";
        }
      }
      case BASE_TYPE_STRUCT: {
        if (IsStruct(type)) {
          const auto &struct_attrs = type.struct_def->attributes;
          const auto native_type = struct_attrs.Lookup("native_type");
          if (native_type) {
            std::string unpack_call = "::flatbuffers::UnPack";
            const auto pack_name = struct_attrs.Lookup("native_type_pack_name");
            if (pack_name) { unpack_call += pack_name->constant; }
            unpack_call += "(*" + val + ")";
            return unpack_call;
          } else if (invector || afield.native_inline) {
            return "*" + val;
          } else {
            const auto name = WrapInNameSpace(*type.struct_def);
            const auto ptype = GenTypeNativePtr(name, &afield, true);
            return ptype + "(new " + name + "(*" + val + "))";
          }
        } else {
          std::string ptype = afield.native_inline ? "*" : "";
          ptype += GenTypeNativePtr(
              WrapNativeNameInNameSpace(*type.struct_def, opts_), &afield,
              true);
          return ptype + "(" + val + "->UnPack(_resolver))";
        }
      }
      case BASE_TYPE_UNION: {
        return GenUnionUnpackVal(
            afield, invector ? "->Get(_i)" : "",
            invector ? ("->GetEnum<" + type.enum_def->name + ">(_i)").c_str()
                     : "");
      }
      default: {
        return val;
        break;
      }
    }
  }